

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFalse.c
# Opt level: O2

Gia_Man_t *
Gia_ManCheckFalseAll(Gia_Man_t *p,int nSlackMax,int nTimeOut,int fVerbose,int fVeryVerbose)

{
  int iVar1;
  Gia_Man_t *p_00;
  Gia_Obj_t *pObj;
  Gia_Man_t *p_01;
  int v;
  uint uVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  
  p_00 = Gia_ManDup(p);
  uVar2 = 0;
  iVar3 = 0;
  do {
    Gia_ManLevelNum(p_00);
    iVar4 = iVar3;
    for (v = 0; v < p_00->nObjs; v = v + 1) {
      pObj = Gia_ManObj(p_00,v);
      if (pObj == (Gia_Obj_t *)0x0) break;
      if ((~*(uint *)pObj & 0x1fffffff) != 0 && -1 < (int)*(uint *)pObj) {
        iVar1 = Gia_ObjLevel(p_00,pObj);
        if (iVar1 <= nSlackMax) {
          uVar2 = uVar2 + 1;
          p_01 = Gia_ManCheckOne(p_00,-1,v,nTimeOut,fVerbose,fVeryVerbose);
          if (p_01 != (Gia_Man_t *)0x0) {
            iVar4 = iVar4 + 1;
            Gia_ManStop(p_00);
            Gia_ManLevelNum(p_01);
            p_00 = p_01;
          }
        }
      }
    }
    bVar5 = iVar3 == iVar4;
    iVar3 = iVar4;
    if (bVar5) {
      printf("Performed %d attempts and %d changes.\n",(ulong)uVar2);
      return p_00;
    }
  } while( true );
}

Assistant:

Gia_Man_t * Gia_ManCheckFalseAll( Gia_Man_t * p, int nSlackMax, int nTimeOut, int fVerbose, int fVeryVerbose )
{
    int Tried = 0, Changed = 0;
    p = Gia_ManDup( p );
    while ( 1 )
    {
        Gia_Man_t * pNew;
        Gia_Obj_t * pObj;
        int i, LevelMax, Changed0 = Changed;
        LevelMax = Gia_ManLevelNum( p );
        Gia_ManForEachAnd( p, pObj, i )
        {
            if ( Gia_ObjLevel(p, pObj) > nSlackMax )
                continue;
            Tried++;
            pNew = Gia_ManCheckOne( p, -1, i, nTimeOut, fVerbose, fVeryVerbose );
            if ( pNew == NULL )
                continue;
            Changed++;
            Gia_ManStop( p );
            p = pNew;
            LevelMax = Gia_ManLevelNum( p );
        }
        if ( Changed0 == Changed )
            break;
    }
//    if ( fVerbose )
        printf( "Performed %d attempts and %d changes.\n", Tried, Changed );
    return p;
}